

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmEmulator.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  RAM *this;
  GEN_Register *this_00;
  SFLAG_Register *this_01;
  long lVar10;
  string *flagName;
  int j;
  long lVar11;
  int i;
  long lVar12;
  allocator<char> local_439;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitCommand;
  string local_410;
  string local_3f0;
  string cmdHolder;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar9 = std::operator<<((ostream *)&std::cout,"AsmEmulator v0.1");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Initializing RAMDISK.");
  std::endl<char,std::char_traits<char>>(poVar9);
  this = (RAM *)operator_new(1);
  RAM::RAM(this);
  this_00 = (GEN_Register *)operator_new(1);
  GEN_Register::GEN_Register(this_00);
  this_01 = (SFLAG_Register *)operator_new(0x20);
  SFLAG_Register::SFLAG_Register(this_01);
  cmdHolder._M_dataplus._M_p = (pointer)&cmdHolder.field_2;
  cmdHolder._M_string_length = 0;
  cmdHolder.field_2._M_local_buf[0] = '\0';
  do {
    std::__cxx11::string::assign((char *)&cmdHolder);
    std::operator<<((ostream *)&std::cout,"> ");
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&cmdHolder);
      bVar1 = std::operator==(&cmdHolder,"");
    } while (bVar1);
    StringHelpers::split(&splitCommand,&cmdHolder,' ');
    bVar1 = std::operator==(splitCommand.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"exit");
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&splitCommand);
      std::__cxx11::string::~string((string *)&cmdHolder);
      return 0;
    }
    bVar1 = std::operator==(splitCommand.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"dumpmem");
    if (bVar1) {
      lVar10 = 0;
      for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
        for (lVar11 = 0; lVar11 != 0x32; lVar11 = lVar11 + 1) {
          bVar2 = RAM::read8Bits(this,lVar11 + lVar10);
          printf("%X ",(ulong)bVar2);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        lVar10 = lVar10 + 0x14;
      }
      goto LAB_00104c87;
    }
    bVar1 = std::operator==(splitCommand.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"dumpgenregs");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"AL",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_50);
      printf("AL: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"AH",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_70);
      printf("AH: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"AX",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_90);
      printf("AX: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"EAX",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_b0);
      printf("EAX: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"DL",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_d0);
      printf("DL: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"DH",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_f0);
      printf("DH: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"DX",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_110);
      printf("DX: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"EDX",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_130);
      printf("EDX: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"CL",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_150);
      printf("CL: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"CH",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_170);
      printf("CH: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"CX",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_190);
      printf("CX: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"ECX",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_1b0);
      printf("ECX: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"BL",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_1d0);
      printf("BL: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"BH",&local_439);
      bVar2 = GEN_Register::getReg_8(this_00,&local_1f0);
      printf("BH: %X\n",(ulong)bVar2);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"BX",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_210);
      printf("BX: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"EBX",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_230);
      printf("EBX: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"BP",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_250);
      printf("BP: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"EBP",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_270);
      printf("EBP: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"SI",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_290);
      printf("SI: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"ESI",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_2b0);
      printf("ESI: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"DI",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_2d0);
      printf("DI: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"EDI",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,&local_2f0);
      printf("EDI: %X\n",(ulong)uVar4);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"SP",&local_439);
      uVar3 = GEN_Register::getReg_16(this_00,&local_310);
      printf("SP: %X\n",(ulong)uVar3);
      std::__cxx11::string::~string((string *)&local_310);
      flagName = &local_330;
      std::__cxx11::string::string<std::allocator<char>>((string *)flagName,"ESP",&local_439);
      uVar4 = GEN_Register::getReg_32(this_00,flagName);
      printf("ESP: %X\n",(ulong)uVar4);
LAB_00104c82:
      std::__cxx11::string::~string((string *)flagName);
    }
    else {
      bVar1 = std::operator==(splitCommand.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"setgenreg");
      if (bVar1) {
        bVar1 = std::operator==(splitCommand.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1,"8");
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&local_3b0,
                     (string *)
                     (splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2));
          std::__cxx11::string::string
                    ((string *)&local_350,
                     (string *)
                     (splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 3));
          iVar5 = StringHelpers::stringToNumber(&local_350);
          flagName = &local_3b0;
          GEN_Register::setReg_8(this_00,flagName,(uint8_t)iVar5);
          std::__cxx11::string::~string((string *)&local_350);
          goto LAB_00104c82;
        }
      }
      else {
        bVar1 = std::operator==(splitCommand.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"writemem-8i");
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&local_3f0,
                     (string *)
                     (splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
          iVar5 = StringHelpers::stringToNumber(&local_3f0);
          std::__cxx11::string::string
                    ((string *)&local_370,
                     (string *)
                     (splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2));
          iVar6 = StringHelpers::stringToNumber(&local_370);
          RAM::read32Bits(this,(long)iVar5,(uint8_t)iVar6);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::string
                    ((string *)&local_410,
                     (string *)
                     (splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2));
          uVar7 = StringHelpers::stringToNumber(&local_410);
          std::__cxx11::string::string
                    ((string *)&local_390,
                     (string *)
                     (splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
          uVar8 = StringHelpers::stringToNumber(&local_390);
          printf("Wrote value 0x%X to memory location 0x%X.\n",(ulong)uVar7,(ulong)uVar8);
          std::__cxx11::string::~string((string *)&local_390);
          flagName = &local_410;
          goto LAB_00104c82;
        }
        Opcodes::run(this_01,this_00,this,&splitCommand);
      }
    }
LAB_00104c87:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&splitCommand);
  } while( true );
}

Assistant:

int main() {
    // Show startup statements.
    std::cout << "AsmEmulator v0.1" << std::endl;
    // Load in a new RAMDISK.
    std::cout << "Initializing RAMDISK." << std::endl;
    RAM *ram = new RAM();
    GEN_Register *gen = new GEN_Register();
    SFLAG_Register *sflag = new SFLAG_Register();
    //////////////////////////////////////////////////////
    // Temporary testing code - remove in final release //
    // Holder for command input.
    std::string cmdHolder;
    // Console input loop.
    while (true) {
        // Reset to an empty value.
        cmdHolder = "";
        // Get input.
        std::cout << "> ";
        while (true) {
            std::getline(std::cin, cmdHolder);
            // If we get an enter key bounce, loop back.
            if (cmdHolder == "") {
                continue;
            } else {
                break;
            }
        }
        // Split up the command into arguments.
        std::vector<std::string> splitCommand = StringHelpers::split(cmdHolder, ' ');
        // Check for exit condition.
        if (splitCommand[0] == "exit") {
            break;
        }
            // Dump the first 1000 bytes of memory.
        else if (splitCommand[0] == "dumpmem") {
            for (int i = 0; i < 20; i++) {
                for (int j = 0; j < 50; j++) {
                    printf("%X ", ram->read8Bits((i * 20) + j));
                }
                std::cout << std::endl;
            }
        }
            // Dump all values in the registry.
        else if (splitCommand[0] == "dumpgenregs") {
            printf("AL: %X\n", gen->getReg_8("AL"));
            printf("AH: %X\n", gen->getReg_8("AH"));
            printf("AX: %X\n", gen->getReg_16("AX"));
            printf("EAX: %X\n", gen->getReg_32("EAX"));

            printf("DL: %X\n", gen->getReg_8("DL"));
            printf("DH: %X\n", gen->getReg_8("DH"));
            printf("DX: %X\n", gen->getReg_16("DX"));
            printf("EDX: %X\n", gen->getReg_32("EDX"));

            printf("CL: %X\n", gen->getReg_8("CL"));
            printf("CH: %X\n", gen->getReg_8("CH"));
            printf("CX: %X\n", gen->getReg_16("CX"));
            printf("ECX: %X\n", gen->getReg_32("ECX"));

            printf("BL: %X\n", gen->getReg_8("BL"));
            printf("BH: %X\n", gen->getReg_8("BH"));
            printf("BX: %X\n", gen->getReg_16("BX"));
            printf("EBX: %X\n", gen->getReg_32("EBX"));

            printf("BP: %X\n", gen->getReg_16("BP"));
            printf("EBP: %X\n", gen->getReg_32("EBP"));

            printf("SI: %X\n", gen->getReg_16("SI"));
            printf("ESI: %X\n", gen->getReg_32("ESI"));

            printf("DI: %X\n", gen->getReg_16("DI"));
            printf("EDI: %X\n", gen->getReg_32("EDI"));

            printf("SP: %X\n", gen->getReg_16("SP"));
            printf("ESP: %X\n", gen->getReg_32("ESP"));
        } else if (splitCommand[0] == "setgenreg") {
            if (splitCommand[1] == "8") {
                gen->setReg_8(splitCommand[2], StringHelpers::stringToNumber(splitCommand[3]));
            }
        }
            // Write an 8-bit value to memory.
        else if (splitCommand[0] == "writemem-8i") {
            ram->write8Bits(StringHelpers::stringToNumber(splitCommand[1]),
                            StringHelpers::stringToNumber(splitCommand[2]));
            printf("Wrote value 0x%X to memory location 0x%X.\n", StringHelpers::stringToNumber(splitCommand[2]),
                   StringHelpers::stringToNumber(splitCommand[1]));
        }
            // Treat command as an opcode.
        else {
            Opcodes::run(*sflag, *gen, *ram, splitCommand);
        }
    }
    //////////////////////////////////////////////////////
    return 0;
}